

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubdirectoryDisposer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::SubdirectoryDisposer::SubdirectoryDisposer
          (SubdirectoryDisposer *this,string *subdirectory)

{
  string *psVar1;
  string *in_RSI;
  string *in_RDI;
  
  ::std::__cxx11::string::string(in_RDI);
  psVar1 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::operator=(in_RDI,psVar1);
  psVar1 = (string *)ApprovalTestNamer::testConfiguration();
  ::std::__cxx11::string::operator=(psVar1,in_RSI);
  return;
}

Assistant:

SubdirectoryDisposer::SubdirectoryDisposer(std::string subdirectory)
    {
        previous_result = ApprovalTestNamer::testConfiguration().subdirectory;
        ApprovalTestNamer::testConfiguration().subdirectory = std::move(subdirectory);
    }